

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O1

int sinc_multichan_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  SINC_FILTER *filter;
  float *pfVar1;
  coeff_t *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined8 local_a8;
  
  filter = (SINC_FILTER *)psrc->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    iVar4 = 5;
  }
  else {
    iVar15 = filter->channels;
    filter->in_count = data->input_frames * (long)iVar15;
    filter->out_count = data->output_frames * (long)iVar15;
    filter->out_gen = 0;
    filter->in_used = 0;
    local_c0 = psrc->last_ratio;
    iVar4 = 0x16;
    if ((0.00390625 <= local_c0) && (local_c0 <= 256.0)) {
      dVar23 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
      dVar21 = local_c0;
      if (data->src_ratio <= local_c0) {
        dVar21 = data->src_ratio;
      }
      lVar10 = lrint((double)(-(ulong)(dVar21 < 1.0) & (ulong)(dVar23 / dVar21) |
                             ~-(ulong)(dVar21 < 1.0) & (ulong)dVar23));
      dVar21 = psrc->last_position;
      lVar11 = lrint(dVar21);
      dVar23 = dVar21 - (double)lVar11;
      dVar23 = (double)(~-(ulong)(dVar23 < 0.0) & (ulong)dVar23 |
                       (ulong)(dVar23 + 1.0) & -(ulong)(dVar23 < 0.0));
      iVar4 = filter->b_current;
      iVar20 = filter->channels;
      lVar11 = lrint(dVar21 - dVar23);
      filter->b_current = (int)((lVar11 * iVar20 + (long)iVar4) % (long)filter->b_len);
      local_a8._0_4_ = SUB84(dVar23,0);
      local_a8._4_4_ = (undefined4)((ulong)dVar23 >> 0x20);
      if (filter->out_gen < filter->out_count) {
        iVar15 = ((int)lVar10 + 1) * iVar15;
        dVar21 = 1.0 / local_c0;
        do {
          if (((filter->b_end - filter->b_current) + filter->b_len) % filter->b_len <= iVar15) {
            iVar4 = prepare_data(filter,data,iVar15);
            psrc->error = iVar4;
            if (iVar4 != 0) {
              return iVar4;
            }
            if (((filter->b_end - filter->b_current) + filter->b_len) % filter->b_len <= iVar15)
            break;
          }
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end <=
              (double)filter->b_current + (double)CONCAT44(local_a8._4_4_,(undefined4)local_a8) +
              dVar21 + 1e-20)) break;
          if (0 < filter->out_count) {
            dVar23 = psrc->last_ratio;
            if (1e-10 < ABS(dVar23 - data->src_ratio)) {
              local_c0 = ((data->src_ratio - dVar23) * (double)filter->out_gen) /
                         (double)filter->out_count + dVar23;
            }
          }
          dVar23 = local_c0;
          if (1.0 <= local_c0) {
            dVar23 = 1.0;
          }
          dVar23 = dVar23 * (double)filter->index_inc;
          lVar11 = lrint(dVar23 * 4096.0);
          lVar12 = lrint(local_a8 * dVar23 * 4096.0);
          iVar4 = filter->index_inc;
          uVar17 = filter->channels;
          uVar18 = (ulong)(int)uVar17;
          pfVar1 = data->data_out;
          lVar10 = filter->out_gen;
          iVar5 = filter->coeff_half_len * 0x1000;
          iVar13 = (int)lVar12;
          iVar16 = (int)lVar11;
          iVar6 = (iVar5 - iVar13) / iVar16;
          uVar19 = iVar6 * iVar16 + iVar13;
          iVar20 = filter->b_current;
          iVar6 = iVar20 - iVar6 * uVar17;
          memset(filter->left_calc,0,uVar18 << 3);
          pcVar2 = filter->coeffs;
          do {
            dVar22 = (double)(pcVar2[(long)((int)uVar19 >> 0xc) + 1] - pcVar2[(int)uVar19 >> 0xc]) *
                     (double)(uVar19 & 0xfff) * 0.000244140625 + (double)pcVar2[(int)uVar19 >> 0xc];
            uVar9 = uVar17;
            do {
              uVar14 = uVar9 + 7;
              if (-1 < (int)uVar9) {
                uVar14 = uVar9;
              }
              uVar8 = uVar9;
              uVar7 = uVar9;
              switch((~uVar14 | 7) + uVar9) {
              case 0:
                break;
              default:
                uVar7 = uVar9 - 1;
                filter->left_calc[(long)(int)uVar9 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar9 + iVar6 + -1) * 4 + -0x58) * dVar22 +
                     filter->left_calc[(long)(int)uVar9 + -1];
              case 6:
                uVar8 = uVar7 - 1;
                filter->left_calc[(long)(int)uVar7 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar7 + iVar6 + -1) * 4 + -0x58) * dVar22 +
                     filter->left_calc[(long)(int)uVar7 + -1];
              case 5:
                uVar9 = uVar8 - 1;
                filter->left_calc[(long)(int)uVar8 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar8 + iVar6 + -1) * 4 + -0x58) * dVar22 +
                     filter->left_calc[(long)(int)uVar8 + -1];
              case 4:
                uVar8 = uVar9 - 1;
                filter->left_calc[(long)(int)uVar9 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar9 + iVar6 + -1) * 4 + -0x58) * dVar22 +
                     filter->left_calc[(long)(int)uVar9 + -1];
              case 3:
                uVar9 = uVar8 - 1;
                filter->left_calc[(long)(int)uVar8 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar8 + iVar6 + -1) * 4 + -0x58) * dVar22 +
                     filter->left_calc[(long)(int)uVar8 + -1];
              case 2:
                uVar8 = uVar9 - 1;
                filter->left_calc[(long)(int)uVar9 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar9 + iVar6 + -1) * 4 + -0x58) * dVar22 +
                     filter->left_calc[(long)(int)uVar9 + -1];
              case 1:
                uVar9 = uVar8 - 1;
                filter->left_calc[(long)(int)uVar8 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar8 + iVar6 + -1) * 4 + -0x58) * dVar22 +
                     filter->left_calc[(long)(int)uVar8 + -1];
              }
              filter->left_calc[(long)(int)uVar9 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(int)(uVar9 + iVar6 + -1) * 4 + -0x58) * dVar22 +
                   filter->left_calc[(long)(int)uVar9 + -1];
              bVar3 = 1 < (int)uVar9;
              uVar9 = uVar9 - 1;
            } while (bVar3);
            iVar6 = iVar6 + uVar17;
            uVar19 = uVar19 - iVar16;
          } while (-1 < (int)uVar19);
          dVar23 = dVar23 / (double)iVar4;
          iVar4 = (iVar5 - (iVar16 - iVar13)) / iVar16;
          iVar20 = (iVar4 + 1) * uVar17 + iVar20;
          memset(filter->right_calc,0,uVar18 << 3);
          uVar19 = iVar4 * iVar16 + (iVar16 - iVar13);
          do {
            dVar22 = (double)(pcVar2[(long)((int)uVar19 >> 0xc) + 1] - pcVar2[(int)uVar19 >> 0xc]) *
                     (double)(uVar19 & 0xfff) * 0.000244140625 + (double)pcVar2[(int)uVar19 >> 0xc];
            uVar9 = uVar17;
            do {
              uVar14 = uVar9 + 7;
              if (-1 < (int)uVar9) {
                uVar14 = uVar9;
              }
              uVar8 = uVar9;
              uVar7 = uVar9;
              switch((~uVar14 | 7) + uVar9) {
              case 0:
                break;
              default:
                uVar7 = uVar9 - 1;
                filter->right_calc[(long)(int)uVar9 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar9 + iVar20 + -1) * 4 + -0x58) * dVar22 +
                     filter->right_calc[(long)(int)uVar9 + -1];
              case 6:
                uVar8 = uVar7 - 1;
                filter->right_calc[(long)(int)uVar7 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar7 + iVar20 + -1) * 4 + -0x58) * dVar22 +
                     filter->right_calc[(long)(int)uVar7 + -1];
              case 5:
                uVar9 = uVar8 - 1;
                filter->right_calc[(long)(int)uVar8 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar8 + iVar20 + -1) * 4 + -0x58) * dVar22 +
                     filter->right_calc[(long)(int)uVar8 + -1];
              case 4:
                uVar8 = uVar9 - 1;
                filter->right_calc[(long)(int)uVar9 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar9 + iVar20 + -1) * 4 + -0x58) * dVar22 +
                     filter->right_calc[(long)(int)uVar9 + -1];
              case 3:
                uVar9 = uVar8 - 1;
                filter->right_calc[(long)(int)uVar8 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar8 + iVar20 + -1) * 4 + -0x58) * dVar22 +
                     filter->right_calc[(long)(int)uVar8 + -1];
              case 2:
                uVar8 = uVar9 - 1;
                filter->right_calc[(long)(int)uVar9 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar9 + iVar20 + -1) * 4 + -0x58) * dVar22 +
                     filter->right_calc[(long)(int)uVar9 + -1];
              case 1:
                uVar9 = uVar8 - 1;
                filter->right_calc[(long)(int)uVar8 + -1] =
                     (double)*(float *)((long)filter[1].left_calc +
                                       (long)(int)(uVar8 + iVar20 + -1) * 4 + -0x58) * dVar22 +
                     filter->right_calc[(long)(int)uVar8 + -1];
              }
              filter->right_calc[(long)(int)uVar9 + -1] =
                   (double)*(float *)((long)filter[1].left_calc +
                                     (long)(int)(uVar9 + iVar20 + -1) * 4 + -0x58) * dVar22 +
                   filter->right_calc[(long)(int)uVar9 + -1];
              bVar3 = 1 < (int)uVar9;
              uVar9 = uVar9 - 1;
            } while (bVar3);
            iVar20 = iVar20 - uVar17;
            uVar9 = uVar19 - iVar16;
            bVar3 = iVar16 <= (int)uVar19;
            uVar19 = uVar9;
          } while (uVar9 != 0 && bVar3);
          do {
            uVar17 = (uint)uVar18;
            uVar19 = uVar17 + 7;
            if (-1 < (int)uVar17) {
              uVar19 = uVar17;
            }
            switch((~uVar19 | 7) + uVar17) {
            case 0:
              break;
            default:
              lVar11 = (long)(int)uVar17;
              uVar17 = uVar17 - 1;
              pfVar1[lVar10 + lVar11 + -1] =
                   (float)((filter->left_calc[lVar11 + -1] + filter->right_calc[lVar11 + -1]) *
                          dVar23);
            case 6:
              lVar11 = (long)(int)uVar17;
              uVar17 = uVar17 - 1;
              pfVar1[lVar10 + lVar11 + -1] =
                   (float)((filter->left_calc[lVar11 + -1] + filter->right_calc[lVar11 + -1]) *
                          dVar23);
            case 5:
              lVar11 = (long)(int)uVar17;
              uVar17 = uVar17 - 1;
              pfVar1[lVar10 + lVar11 + -1] =
                   (float)((filter->left_calc[lVar11 + -1] + filter->right_calc[lVar11 + -1]) *
                          dVar23);
            case 4:
              lVar11 = (long)(int)uVar17;
              uVar17 = uVar17 - 1;
              pfVar1[lVar10 + lVar11 + -1] =
                   (float)((filter->left_calc[lVar11 + -1] + filter->right_calc[lVar11 + -1]) *
                          dVar23);
            case 3:
              lVar11 = (long)(int)uVar17;
              uVar17 = uVar17 - 1;
              pfVar1[lVar10 + lVar11 + -1] =
                   (float)((filter->left_calc[lVar11 + -1] + filter->right_calc[lVar11 + -1]) *
                          dVar23);
            case 2:
              lVar11 = (long)(int)uVar17;
              uVar17 = uVar17 - 1;
              pfVar1[lVar10 + lVar11 + -1] =
                   (float)((filter->left_calc[lVar11 + -1] + filter->right_calc[lVar11 + -1]) *
                          dVar23);
            case 1:
              lVar11 = (long)(int)uVar17;
              uVar17 = uVar17 - 1;
              pfVar1[lVar10 + lVar11 + -1] =
                   (float)((filter->left_calc[lVar11 + -1] + filter->right_calc[lVar11 + -1]) *
                          dVar23);
            }
            lVar11 = (long)(int)uVar17;
            uVar18 = (ulong)(uVar17 - 1);
            pfVar1[lVar10 + lVar11 + -1] =
                 (float)((filter->left_calc[lVar11 + -1] + filter->right_calc[lVar11 + -1]) * dVar23
                        );
          } while (1 < (int)uVar17);
          filter->out_gen = filter->out_gen + (long)psrc->channels;
          local_a8 = local_a8 + 1.0 / local_c0;
          lVar10 = lrint(local_a8);
          dVar23 = local_a8 - (double)lVar10;
          dVar23 = (double)(~-(ulong)(dVar23 < 0.0) & (ulong)dVar23 |
                           (ulong)(dVar23 + 1.0) & -(ulong)(dVar23 < 0.0));
          iVar4 = filter->b_current;
          iVar20 = filter->channels;
          lVar10 = lrint(local_a8 - dVar23);
          local_b8 = SUB84(dVar23,0);
          uStack_b4 = (undefined4)((ulong)dVar23 >> 0x20);
          filter->b_current = (int)((lVar10 * iVar20 + (long)iVar4) % (long)filter->b_len);
          local_a8._0_4_ = local_b8;
          local_a8._4_4_ = uStack_b4;
        } while (filter->out_gen < filter->out_count);
      }
      *(undefined4 *)&psrc->last_position = (undefined4)local_a8;
      *(undefined4 *)((long)&psrc->last_position + 4) = local_a8._4_4_;
      psrc->last_ratio = local_c0;
      iVar4 = filter->channels;
      data->input_frames_used = filter->in_used / (long)iVar4;
      data->output_frames_gen = filter->out_gen / (long)iVar4;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int
sinc_multichan_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) psrc->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * filter->channels ;
	filter->out_count = data->output_frames * filter->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (psrc->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (psrc->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = filter->channels * (lrint (count) + 1) ;

	input_index = psrc->last_position ;
	float_increment = filter->index_inc ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((psrc->error = prepare_data (filter, data, half_filter_chan_len)) != 0)
				return psrc->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = psrc->last_ratio + filter->out_gen * (data->src_ratio - psrc->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_multi (filter, increment, start_filter_index, filter->channels, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += psrc->channels ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	psrc->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / filter->channels ;
	data->output_frames_gen = filter->out_gen / filter->channels ;

	return SRC_ERR_NO_ERROR ;
}